

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall t_js_generator::generate_const(t_js_generator *this,t_const *tconst)

{
  ostream *poVar1;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  t_const_value *local_48;
  t_const_value *value;
  string name;
  t_type *type;
  t_const *tconst_local;
  t_js_generator *this_local;
  
  name.field_2._8_8_ = t_const::get_type(tconst);
  t_const::get_name_abi_cxx11_((string *)&value,tconst);
  local_48 = t_const::get_value(tconst);
  js_type_namespace_abi_cxx11_
            (&local_78,this,(this->super_t_oop_generator).super_t_generator.program_);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&local_78);
  poVar1 = std::operator<<(poVar1,(string *)&value);
  std::operator<<(poVar1," = ");
  std::__cxx11::string::~string((string *)&local_78);
  render_const_value_abi_cxx11_(&local_98,this,(t_type *)name.field_2._8_8_,local_48);
  poVar1 = std::operator<<((ostream *)&this->f_types_,(string *)&local_98);
  poVar1 = std::operator<<(poVar1,";");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_98);
  if ((this->gen_ts_ & 1U) != 0) {
    ts_print_doc_abi_cxx11_(&local_b8,this,&tconst->super_t_doc);
    poVar1 = std::operator<<((ostream *)&this->f_types_ts_,(string *)&local_b8);
    ts_indent_abi_cxx11_(&local_d8,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_d8);
    ts_declare_abi_cxx11_(&local_f8,this);
    poVar1 = std::operator<<(poVar1,(string *)&local_f8);
    poVar1 = std::operator<<(poVar1,(string *)&this->js_const_type_);
    poVar1 = std::operator<<(poVar1,(string *)&value);
    poVar1 = std::operator<<(poVar1,": ");
    ts_get_type_abi_cxx11_(&local_118,this,(t_type *)name.field_2._8_8_);
    poVar1 = std::operator<<(poVar1,(string *)&local_118);
    poVar1 = std::operator<<(poVar1,";");
    std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  std::__cxx11::string::~string((string *)&value);
  return;
}

Assistant:

void t_js_generator::generate_const(t_const* tconst) {
  t_type* type = tconst->get_type();
  string name = tconst->get_name();
  t_const_value* value = tconst->get_value();

  f_types_ << js_type_namespace(program_) << name << " = ";
  f_types_ << render_const_value(type, value) << ";" << endl;

  if (gen_ts_) {
    f_types_ts_ << ts_print_doc(tconst) << ts_indent() << ts_declare() << js_const_type_ << name << ": "
                << ts_get_type(type) << ";" << endl;
  }
}